

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_path.c
# Opt level: O3

void sys_bashfilename(char *from,char *to)

{
  char cVar1;
  char *pcVar2;
  
  cVar1 = *from;
  if (cVar1 != '\0') {
    pcVar2 = from + 1;
    do {
      *to = cVar1;
      to = to + 1;
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar1 != '\0');
  }
  *to = '\0';
  return;
}

Assistant:

void sys_bashfilename(const char *from, char *to)
{
    char c;
    while ((c = *from++))
    {
#ifdef _WIN32
        if (c == '/') c = '\\';
#endif
        *to++ = c;
    }
    *to = 0;
}